

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O1

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessShaderDeclaration
          (ConversionStream *this,iterator EntryPointToken,SHADER_TYPE ShaderType)

{
  TokenListType *this_00;
  ostream *poVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  StreamType SVar3;
  pointer pSVar4;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> _Var5;
  ConversionStream *pCVar6;
  pointer EntryPoint_00;
  long lVar7;
  char *pcVar8;
  char (*in_R8) [21];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args;
  ulong uVar9;
  pointer pSVar10;
  uint uVar11;
  bool bVar12;
  bool bIsVoid;
  iterator TypeToken;
  string err_1;
  iterator FirstStatementToken;
  char *EntryPoint;
  vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
  ShaderParams;
  String Prologue;
  String GlobalVariables;
  iterator BodyEndToken;
  iterator ArgsListEndToken;
  stringstream ReturnHandlerSS;
  bool local_389;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> local_388;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> local_380;
  undefined1 local_378 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_360;
  _Alloc_hider local_350;
  size_type local_348;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_340;
  size_t local_330;
  String local_328;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> local_308;
  _List_node_base *local_300;
  vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
  local_2f8;
  String local_2d8;
  String local_2b8;
  ConversionStream *local_298;
  iterator local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_288;
  size_type local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_268;
  size_type local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_248;
  size_type local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_228;
  size_type local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_208;
  size_type local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  ulong local_1c8;
  iterator local_1c0;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [7];
  ios_base local_138 [264];
  
  uVar9 = (ulong)ShaderType;
  local_300 = EntryPointToken._M_node[1]._M_prev;
  local_388._M_node = (EntryPointToken._M_node)->_M_prev;
  if (local_388._M_node ==
      (this->m_Tokens).
      super__List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
      ._M_impl._M_node.super__List_node_base._M_next) {
    FormatString<char[11],std::__cxx11::string,char[21]>
              ((string *)local_1b8,(Diligent *)"Function \"",
               (char (*) [11])&EntryPointToken._M_node[1]._M_prev,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               "\" misses return type",in_R8);
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              ((String *)local_378,this,&local_388,4);
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessShaderDeclaration",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x1027,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1b8,(char (*) [2])0x6e9945,(String *)local_378);
    if ((undefined1 *)CONCAT44(local_378._4_4_,local_378._0_4_) != local_378 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_378._4_4_,local_378._0_4_),local_378._16_8_ + 1);
    }
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
    }
  }
  local_2f8.
  super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.
  super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.
  super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c0._M_node = local_388._M_node;
  local_389 = false;
  ProcessFunctionParameters(this,&local_1c0,&local_2f8,&local_389);
  std::__cxx11::string::_M_replace
            ((ulong)&EntryPointToken._M_node[1]._M_prev,0,(char *)EntryPointToken._M_node[2]._M_next
             ,0x70e4c2);
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  poVar1 = (ostream *)(local_1b8 + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"#define ",8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"_RETURN_",8);
  pcVar8 = "(_RET_VAL_)";
  if (local_389 != false) {
    pcVar8 = "";
  }
  lVar7 = 0xb;
  if (local_389 != false) {
    lVar7 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar8,lVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," {\\\n",4);
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  local_2b8._M_string_length = 0;
  local_2b8.field_2._M_local_buf[0] = '\0';
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  local_2d8._M_string_length = 0;
  local_2d8.field_2._M_local_buf[0] = '\0';
  local_1c8 = uVar9;
  switch(ShaderType) {
  case SHADER_TYPE_VERTEX:
    ProcessVertexShaderArguments(this,&local_2f8,&local_2b8,(stringstream *)local_1b8,&local_2d8);
    break;
  case SHADER_TYPE_PIXEL:
    ProcessFragmentShaderArguments
              (this,&local_388,&local_2f8,&local_2b8,(stringstream *)local_1b8,&local_2d8);
    break;
  case SHADER_TYPE_VS_PS:
  case SHADER_TYPE_GEOMETRY|SHADER_TYPE_VERTEX:
  case SHADER_TYPE_GEOMETRY|SHADER_TYPE_PIXEL:
  case SHADER_TYPE_GEOMETRY|SHADER_TYPE_VS_PS:
    break;
  case SHADER_TYPE_GEOMETRY:
    ProcessGeometryShaderArguments(this,&local_388,&local_2f8,&local_2b8,&local_2d8);
    break;
  case SHADER_TYPE_HULL:
    ProcessHullShaderArguments
              (this,&local_388,&local_2f8,&local_2b8,(stringstream *)local_1b8,&local_2d8);
    break;
  default:
    if (ShaderType == SHADER_TYPE_DOMAIN) {
      ProcessDomainShaderArguments
                (this,&local_388,&local_2f8,&local_2b8,(stringstream *)local_1b8,&local_2d8);
    }
    else if (ShaderType == SHADER_TYPE_COMPUTE) {
      ProcessComputeShaderArguments(this,&local_388,&local_2f8,&local_2b8,&local_2d8);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"return;}\n",9);
  _Var5._M_node = local_388._M_node;
  std::__cxx11::string::string
            ((string *)&local_1e8,local_2b8._M_dataplus._M_p,(allocator *)&local_328);
  std::__cxx11::string::string
            ((string *)&local_208,(char *)local_388._M_node[3]._M_prev,(allocator *)&local_380);
  local_378._0_4_ = TextBlock;
  if (local_1e8 == &local_1d8) {
    local_360._8_8_ = local_1d8._8_8_;
    local_378._8_8_ = &local_360;
  }
  else {
    local_378._8_8_ = local_1e8;
  }
  local_360._M_allocated_capacity._1_7_ = local_1d8._M_allocated_capacity._1_7_;
  local_360._M_local_buf[0] = local_1d8._M_local_buf[0];
  this_00 = &this->m_Tokens;
  local_378._16_8_ = local_1e0;
  local_1e0 = 0;
  local_1d8._M_local_buf[0] = '\0';
  if (local_208 == &local_1f8) {
    local_340._8_8_ = local_1f8._8_8_;
    local_350._M_p = (pointer)&local_340;
  }
  else {
    local_350._M_p = (pointer)local_208;
  }
  local_340._M_allocated_capacity._1_7_ = local_1f8._M_allocated_capacity._1_7_;
  local_340._M_local_buf[0] = local_1f8._M_local_buf[0];
  local_348 = local_200;
  local_200 = 0;
  local_1f8._M_local_buf[0] = '\0';
  local_330 = 0xffffffffffffffff;
  local_298 = this;
  local_208 = &local_1f8;
  local_1e8 = &local_1d8;
  std::__cxx11::
  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
  emplace<Diligent::Parsing::HLSLTokenInfo>
            (this_00,(const_iterator)_Var5._M_node,(HLSLTokenInfo *)local_378);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_p != &local_340) {
    operator_delete(local_350._M_p,local_340._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._8_8_ != &local_360) {
    operator_delete((void *)local_378._8_8_,local_360._0_8_ + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,
                    CONCAT71(local_1f8._M_allocated_capacity._1_7_,local_1f8._M_local_buf[0]) + 1);
  }
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8,
                    CONCAT71(local_1d8._M_allocated_capacity._1_7_,local_1d8._M_local_buf[0]) + 1);
  }
  _Var5._M_node = local_388._M_node;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string
            ((string *)&local_228,local_328._M_dataplus._M_p,(allocator *)&local_380);
  local_268 = &local_258;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"\n","");
  local_378._0_4_ = TextBlock;
  if (local_228 == &local_218) {
    local_360._8_8_ = local_218._8_8_;
    local_378._8_8_ = &local_360;
  }
  else {
    local_378._8_8_ = local_228;
  }
  local_360._M_allocated_capacity._1_7_ = local_218._M_allocated_capacity._1_7_;
  local_360._M_local_buf[0] = local_218._M_local_buf[0];
  local_378._16_8_ = local_220;
  local_220 = 0;
  local_218._M_local_buf[0] = '\0';
  if (local_268 == &local_258) {
    local_340._8_8_ = local_258._8_8_;
    local_350._M_p = (pointer)&local_340;
  }
  else {
    local_350._M_p = (pointer)local_268;
  }
  local_340._M_allocated_capacity._1_7_ = local_258._M_allocated_capacity._1_7_;
  local_340._M_local_buf[0] = local_258._M_local_buf[0];
  local_348 = local_260;
  local_260 = 0;
  local_258._M_local_buf[0] = '\0';
  local_330 = 0xffffffffffffffff;
  local_268 = &local_258;
  local_228 = &local_218;
  std::__cxx11::
  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
  emplace<Diligent::Parsing::HLSLTokenInfo>
            (this_00,(const_iterator)_Var5._M_node,(HLSLTokenInfo *)local_378);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_p != &local_340) {
    operator_delete(local_350._M_p,local_340._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._8_8_ != &local_360) {
    operator_delete((void *)local_378._8_8_,local_360._0_8_ + 1);
  }
  if (local_268 != &local_258) {
    operator_delete(local_268,
                    CONCAT71(local_258._M_allocated_capacity._1_7_,local_258._M_local_buf[0]) + 1);
  }
  if (local_228 != &local_218) {
    operator_delete(local_228,
                    CONCAT71(local_218._M_allocated_capacity._1_7_,local_218._M_local_buf[0]) + 1);
  }
  pCVar6 = local_298;
  paVar2 = &local_328.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != paVar2) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  Args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  std::__cxx11::string::_M_replace
            ((ulong)&local_388._M_node[3]._M_prev,0,(char *)local_388._M_node[4]._M_next,0x6e9945);
  for (local_380._M_node = local_1c0._M_node; (_List_node_base *)this_00 != local_380._M_node;
      local_380._M_node = (local_380._M_node)->_M_next) {
    if (*(int *)&local_380._M_node[1]._M_next == 0x133) {
      if ((_List_node_base *)this_00 != local_380._M_node) goto LAB_002e04ab;
      break;
    }
  }
  FormatString<char[74],char_const*,char[3]>
            ((string *)local_378,
             (Diligent *)
             "Unexpected end of file while looking for the body of shader entry point \"",
             (char (*) [74])&local_300,(char **)0x6fa8bd,(char (*) [3])Args);
  PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
            (&local_328,pCVar6,&local_380,4);
  Args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378;
  LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
            (false,"ProcessShaderDeclaration",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
             ,0x1069,Args,(char (*) [2])0x6e9945,&local_328);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != paVar2) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)CONCAT44(local_378._4_4_,local_378._0_4_) != local_378 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_378._4_4_,local_378._0_4_),local_378._16_8_ + 1);
  }
LAB_002e04ab:
  local_308._M_node = (local_380._M_node)->_M_next;
  if (local_308._M_node == (_List_node_base *)this_00) {
    FormatString<char[74],char_const*,char[3]>
              ((string *)local_378,
               (Diligent *)
               "Unexpected end of file while looking for the body of shader entry point \"",
               (char (*) [74])&local_300,(char **)0x6fa8bd,(char (*) [3])Args);
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_328,pCVar6,&local_308,4);
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessShaderDeclaration",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x1070,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_378,(char (*) [2])0x6e9945,&local_328);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != paVar2) {
      operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)CONCAT44(local_378._4_4_,local_378._0_4_) != local_378 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_378._4_4_,local_378._0_4_),local_378._16_8_ + 1);
    }
  }
  _Var5._M_node = local_308._M_node;
  std::__cxx11::string::string
            ((string *)&local_248,local_2d8._M_dataplus._M_p,(allocator *)&local_328);
  local_288 = &local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"\n","");
  local_378._0_4_ = TextBlock;
  if (local_248 == &local_238) {
    local_360._8_8_ = local_238._8_8_;
    local_378._8_8_ = &local_360;
  }
  else {
    local_378._8_8_ = local_248;
  }
  local_360._M_allocated_capacity._1_7_ = local_238._M_allocated_capacity._1_7_;
  local_360._M_local_buf[0] = local_238._M_local_buf[0];
  local_378._16_8_ = local_240;
  local_240 = 0;
  local_238._M_local_buf[0] = '\0';
  if (local_288 == &local_278) {
    local_340._8_8_ = local_278._8_8_;
    local_350._M_p = (pointer)&local_340;
  }
  else {
    local_350._M_p = (pointer)local_288;
  }
  local_340._M_allocated_capacity._1_7_ = local_278._M_allocated_capacity._1_7_;
  local_340._M_local_buf[0] = local_278._M_local_buf[0];
  local_348 = local_280;
  local_280 = 0;
  local_278._M_local_buf[0] = '\0';
  local_330 = 0xffffffffffffffff;
  local_288 = &local_278;
  local_248 = &local_238;
  std::__cxx11::
  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
  emplace<Diligent::Parsing::HLSLTokenInfo>
            (this_00,(const_iterator)_Var5._M_node,(HLSLTokenInfo *)local_378);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_p != &local_340) {
    operator_delete(local_350._M_p,local_340._M_allocated_capacity + 1);
  }
  uVar9 = local_1c8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._8_8_ != &local_360) {
    operator_delete((void *)local_378._8_8_,local_360._0_8_ + 1);
  }
  if (local_288 != &local_278) {
    operator_delete(local_288,
                    CONCAT71(local_278._M_allocated_capacity._1_7_,local_278._M_local_buf[0]) + 1);
  }
  if (local_248 != &local_238) {
    operator_delete(local_248,
                    CONCAT71(local_238._M_allocated_capacity._1_7_,local_238._M_local_buf[0]) + 1);
  }
  pCVar6 = local_298;
  local_290._M_node = local_380._M_node;
  uVar11 = (uint)uVar9;
  if (0x10 < uVar11) goto LAB_002e0740;
  if ((0x10106U >> (uVar11 & 0x1f) & 1) != 0) {
    ProcessReturnStatements(local_298,&local_290,local_389,(Char *)local_300,"_RETURN_");
    goto LAB_002e0740;
  }
  if (uVar11 != 4) goto LAB_002e0740;
  bVar12 = local_2f8.
           super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           local_2f8.
           super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pSVar10 = local_2f8.
            super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (bVar12) {
LAB_002e0825:
    FormatString<char[38]>
              ((string *)local_378,(char (*) [38])"Unable to find output stream variable");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_328,pCVar6,&local_308,4);
    EntryPoint_00 = (pointer)0x1080;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessShaderDeclaration",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x1080,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_378,(char (*) [2])0x6e9945,&local_328);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)CONCAT44(local_378._4_4_,local_378._0_4_) != local_378 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_378._4_4_,local_378._0_4_),local_378._16_8_ + 1);
    }
  }
  else {
    SVar3 = ((local_2f8.
              super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
              ._M_impl.super__Vector_impl_data._M_start)->GSAttribs).Stream;
    pSVar4 = local_2f8.
             super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    while (SVar3 == Undefined) {
      pSVar10 = pSVar4 + 1;
      bVar12 = pSVar10 ==
               local_2f8.
               super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (bVar12) goto LAB_002e0825;
      SVar3 = pSVar4[1].GSAttribs.Stream;
      pSVar4 = pSVar10;
    }
    EntryPoint_00 =
         local_2f8.
         super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pSVar10 = pSVar4;
    if (bVar12) goto LAB_002e0825;
  }
  ProcessGSOutStreamOperations(pCVar6,&local_290,&pSVar10->Name,(char *)EntryPoint_00);
LAB_002e0740:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,
                    CONCAT71(local_2d8.field_2._M_allocated_capacity._1_7_,
                             local_2d8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,
                    CONCAT71(local_2b8.field_2._M_allocated_capacity._1_7_,
                             local_2b8.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  std::
  vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
  ::~vector(&local_2f8);
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ProcessShaderDeclaration(TokenListType::iterator EntryPointToken, SHADER_TYPE ShaderType)
{
    const auto* EntryPoint = EntryPointToken->Literal.c_str();

    auto TypeToken = EntryPointToken;
    --TypeToken;
    // void TestPS  ( in VSOutput In,
    // ^
    // TypeToken
    VERIFY_PARSER_STATE(TypeToken, TypeToken != m_Tokens.begin(), "Function \"", EntryPointToken->Literal, "\" misses return type");

    std::vector<ShaderParameterInfo> ShaderParams;

    auto ArgsListEndToken = TypeToken;
    bool bIsVoid          = false;
    ProcessFunctionParameters(ArgsListEndToken, ShaderParams, bIsVoid);

    EntryPointToken->Literal = "main";
    //void main ()

    std::stringstream ReturnHandlerSS;
    const Char*       ReturnMacroName = "_RETURN_";
    // Some GLES compilers cannot properly handle macros with empty argument lists, such as _RETURN_().
    // Also, some compilers generate an error if there is no whitespace after the macro without arguments: _RETURN_{
    ReturnHandlerSS << "#define " << ReturnMacroName << (bIsVoid ? "" : "(_RET_VAL_)") << " {\\\n";

    String GlobalVariables, Prologue;
    try
    {
        if (ShaderType == SHADER_TYPE_PIXEL)
        {
            ProcessFragmentShaderArguments(TypeToken, ShaderParams, GlobalVariables, ReturnHandlerSS, Prologue);
        }
        else if (ShaderType == SHADER_TYPE_VERTEX)
        {
            ProcessVertexShaderArguments(ShaderParams, GlobalVariables, ReturnHandlerSS, Prologue);
        }
        else if (ShaderType == SHADER_TYPE_GEOMETRY)
        {
            ProcessGeometryShaderArguments(TypeToken, ShaderParams, GlobalVariables, Prologue);
        }
        else if (ShaderType == SHADER_TYPE_HULL)
        {
            ProcessHullShaderArguments(TypeToken, ShaderParams, GlobalVariables, ReturnHandlerSS, Prologue);
        }
        else if (ShaderType == SHADER_TYPE_DOMAIN)
        {
            ProcessDomainShaderArguments(TypeToken, ShaderParams, GlobalVariables, ReturnHandlerSS, Prologue);
        }
        else if (ShaderType == SHADER_TYPE_COMPUTE)
        {
            ProcessComputeShaderArguments(TypeToken, ShaderParams, GlobalVariables, Prologue);
        }
    }
    catch (const std::runtime_error&)
    {
        LOG_ERROR_AND_THROW("Failed to process shader parameters for shader \"", EntryPoint, "\".");
    }
    ReturnHandlerSS << "return;}\n";


    // void main ()
    // ^
    // TypeToken

    // Insert global variables & return handler before the function
    m_Tokens.insert(TypeToken, TokenInfo(TokenType::TextBlock, GlobalVariables.c_str(), TypeToken->Delimiter.c_str()));
    m_Tokens.insert(TypeToken, TokenInfo(TokenType::TextBlock, ReturnHandlerSS.str().c_str(), "\n"));
    TypeToken->Delimiter = "\n";
    auto BodyStartToken  = ArgsListEndToken;
    while (BodyStartToken != m_Tokens.end() && BodyStartToken->Type != TokenType::OpenBrace)
        ++BodyStartToken;
    // void main ()
    // {
    // ^
    VERIFY_PARSER_STATE(BodyStartToken, BodyStartToken != m_Tokens.end(), "Unexpected end of file while looking for the body of shader entry point \"", EntryPoint, "\".");
    auto FirstStatementToken = BodyStartToken;
    ++FirstStatementToken;
    // void main ()
    // {
    //      int a;
    //      ^
    VERIFY_PARSER_STATE(FirstStatementToken, FirstStatementToken != m_Tokens.end(), "Unexpected end of file while looking for the body of shader entry point \"", EntryPoint, "\".");

    // Insert prologue before the first token
    m_Tokens.insert(FirstStatementToken, TokenInfo(TokenType::TextBlock, Prologue.c_str(), "\n"));

    auto BodyEndToken = BodyStartToken;
    if (ShaderType == SHADER_TYPE_VERTEX || ShaderType == SHADER_TYPE_HULL || ShaderType == SHADER_TYPE_DOMAIN || ShaderType == SHADER_TYPE_PIXEL)
    {
        ProcessReturnStatements(BodyEndToken, bIsVoid, EntryPoint, ReturnMacroName);
    }
    else if (ShaderType == SHADER_TYPE_GEOMETRY)
    {
        auto OutStreamParamIt = ShaderParams.begin();
        for (; OutStreamParamIt != ShaderParams.end(); ++OutStreamParamIt)
            if (OutStreamParamIt->GSAttribs.Stream != ShaderParameterInfo::GSAttributes::StreamType::Undefined)
                break;
        VERIFY_PARSER_STATE(FirstStatementToken, OutStreamParamIt != ShaderParams.end(), "Unable to find output stream variable");
        ProcessGSOutStreamOperations(BodyEndToken, OutStreamParamIt->Name, EntryPoint);
    }
}